

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.cpp
# Opt level: O1

void __thiscall
cppcms::sessions::impl::hmac_cipher::hmac_cipher(hmac_cipher *this,string *hash_name,key *k)

{
  pointer pcVar1;
  size_t sVar2;
  runtime_error *this_00;
  string local_50;
  
  (this->super_encryptor)._vptr_encryptor = (_func_int **)&PTR_encrypt_0028c548;
  crypto::key::key(&this->key_,k);
  (this->hash_)._M_dataplus._M_p = (pointer)&(this->hash_).field_2;
  pcVar1 = (hash_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->hash_,pcVar1,pcVar1 + hash_name->_M_string_length);
  sVar2 = crypto::key::size(&this->key_);
  if (0xf < sVar2) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "The key legth is too small, use at leaset the key of 16 bytes/32 hexadecimal digits",
             "");
  booster::runtime_error::runtime_error(this_00,&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_00287810;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

hmac_cipher::hmac_cipher(std::string const &hash_name,crypto::key const &k) :
	key_(k),
	hash_(hash_name)
{
	if(key_.size() < 16) {
		throw cppcms_error("The key legth is too small, use at leaset the key of 16 bytes/32 hexadecimal digits");
	}
}